

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLElement::DeleteAttribute(XMLElement *this,char *name)

{
  bool bVar1;
  char *q;
  XMLAttribute *local_28;
  XMLAttribute *a;
  XMLAttribute *prev;
  char *name_local;
  XMLElement *this_local;
  
  a = (XMLAttribute *)0x0;
  local_28 = this->_rootAttribute;
  while( true ) {
    if (local_28 == (XMLAttribute *)0x0) {
      return;
    }
    q = XMLAttribute::Name(local_28);
    bVar1 = XMLUtil::StringEqual(name,q,0x7fffffff);
    if (bVar1) break;
    a = local_28;
    local_28 = local_28->_next;
  }
  if (a == (XMLAttribute *)0x0) {
    this->_rootAttribute = local_28->_next;
  }
  else {
    a->_next = local_28->_next;
  }
  DeleteAttribute(local_28);
  return;
}

Assistant:

void XMLElement::DeleteAttribute( const char* name )
{
    XMLAttribute* prev = 0;
    for( XMLAttribute* a=_rootAttribute; a; a=a->_next ) {
        if ( XMLUtil::StringEqual( name, a->Name() ) ) {
            if ( prev ) {
                prev->_next = a->_next;
            }
            else {
                _rootAttribute = a->_next;
            }
            DeleteAttribute( a );
            break;
        }
        prev = a;
    }
}